

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

string * BCLog::LogEscapeMessage_abi_cxx11_(string_view str)

{
  byte bVar1;
  long lVar2;
  byte *fmt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  char ch_in;
  const_iterator __end1;
  const_iterator __begin1;
  string_view *__range1;
  string *ret;
  uint8_t ch;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff90;
  byte *local_60;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  std::__cxx11::string::string(in_stack_ffffffffffffff80);
  local_60 = (byte *)std::basic_string_view<char,_std::char_traits<char>_>::begin
                               ((basic_string_view<char,_std::char_traits<char>_> *)
                                in_stack_ffffffffffffff68);
  fmt = (byte *)std::basic_string_view<char,_std::char_traits<char>_>::end
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_ffffffffffffff68);
  for (; local_60 != fmt; local_60 = local_60 + 1) {
    bVar1 = *local_60;
    if (((bVar1 < 0x20) && (bVar1 != 10)) || (bVar1 == 0x7f)) {
      tinyformat::format<unsigned_char>
                ((char *)fmt,(uchar *)CONCAT17(bVar1,in_stack_ffffffffffffff90));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (this,in_RDI);
      std::__cxx11::string::~string(in_stack_ffffffffffffff68);
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (this,(char)((ulong)in_RDI >> 0x38));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

std::string LogEscapeMessage(std::string_view str) {
        std::string ret;
        for (char ch_in : str) {
            uint8_t ch = (uint8_t)ch_in;
            if ((ch >= 32 || ch == '\n') && ch != '\x7f') {
                ret += ch_in;
            } else {
                ret += strprintf("\\x%02x", ch);
            }
        }
        return ret;
    }